

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O3

void __thiscall quickpool::ThreadPool::set_thread_affinity(ThreadPool *this)

{
  ulong uVar1;
  int iVar2;
  runtime_error *this_00;
  pointer ptVar3;
  ulong uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> avail_cores;
  cpu_set_t cpuset;
  void *local_b0;
  long local_a8;
  cpu_set_t local_98;
  
  sched::get_avail_cores();
  ptVar3 = (this->workers_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->workers_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish != ptVar3) {
    uVar4 = 0;
    do {
      local_98.__bits[0xe] = 0;
      local_98.__bits[0xf] = 0;
      local_98.__bits[0xc] = 0;
      local_98.__bits[0xd] = 0;
      local_98.__bits[10] = 0;
      local_98.__bits[0xb] = 0;
      local_98.__bits[8] = 0;
      local_98.__bits[9] = 0;
      local_98.__bits[6] = 0;
      local_98.__bits[7] = 0;
      local_98.__bits[4] = 0;
      local_98.__bits[5] = 0;
      local_98.__bits[2] = 0;
      local_98.__bits[3] = 0;
      local_98.__bits[0] = 0;
      local_98.__bits[1] = 0;
      uVar1 = *(ulong *)((long)local_b0 + (uVar4 % (ulong)(local_a8 - (long)local_b0 >> 3)) * 8);
      if (uVar1 < 0x400) {
        local_98.__bits[uVar1 >> 6] = local_98.__bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
      }
      iVar2 = pthread_setaffinity_np(ptVar3[uVar4]._M_id._M_thread,0x80,&local_98);
      if (iVar2 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Error calling pthread_setaffinity_np");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar4 = uVar4 + 1;
      ptVar3 = (this->workers_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->workers_).
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ptVar3 >> 3));
  }
  if (local_b0 != (void *)0x0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void set_thread_affinity()
    {
        cpu_set_t cpuset;
        auto avail_cores = sched::get_avail_cores();
        for (size_t id = 0; id < workers_.size(); id++) {
            CPU_ZERO(&cpuset);
            CPU_SET(avail_cores[id % avail_cores.size()], &cpuset);
            int rc = pthread_setaffinity_np(
              workers_.at(id).native_handle(), sizeof(cpu_set_t), &cpuset);
            if (rc != 0) {
                throw std::runtime_error(
                  "Error calling pthread_setaffinity_np");
            }
        }
    }